

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

void __thiscall
toml::basic_value<toml::type_config>::throw_bad_cast
          (basic_value<toml::type_config> *this,string *funcname,value_t ty)

{
  undefined8 uVar1;
  undefined8 in_RDI;
  value_t ty_00;
  string *unaff_retaddr;
  basic_value<toml::type_config> *in_stack_00000008;
  error_info *in_stack_00000098;
  basic_value<toml::type_config> *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 uVar2;
  string *in_stack_fffffffffffffee8;
  type_error *in_stack_fffffffffffffef0;
  
  ty_00 = (value_t)((ulong)in_RDI >> 0x38);
  uVar2 = 1;
  uVar1 = __cxa_allocate_exception(0xa0);
  toml::detail::make_type_error<toml::type_config>(in_stack_00000008,unaff_retaddr,ty_00);
  format_error_abi_cxx11_(in_stack_00000098);
  location(in_stack_fffffffffffffec8);
  type_error::type_error
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (source_location *)CONCAT17(uVar2,in_stack_fffffffffffffee0));
  __cxa_throw(uVar1,&type_error::typeinfo,type_error::~type_error);
}

Assistant:

[[noreturn]]
    void throw_bad_cast(const std::string& funcname, const value_t ty) const
    {
        throw type_error(format_error(detail::make_type_error(*this, funcname, ty)),
                         this->location());
    }